

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Choice.cpp
# Opt level: O0

void __thiscall Inferences::Choice::AxiomsIterator::AxiomsIterator(AxiomsIterator *this,Term *term)

{
  Iterator it;
  TermList *pTVar1;
  TermList TVar2;
  TermList TVar3;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar4;
  Term *in_RSI;
  long in_RDI;
  Iterator opsIt;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *ops;
  TermList in_stack_ffffffffffffff38;
  Iterator *in_stack_ffffffffffffff40;
  TermList in_stack_ffffffffffffff50;
  TermList in_stack_ffffffffffffff58;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *pDStack_60;
  
  Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
            ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x792f61);
  Kernel::TermList::TermList((TermList *)(in_RDI + 0x28));
  Kernel::TermList::TermList((TermList *)(in_RDI + 0x30));
  Kernel::TermList::TermList((TermList *)(in_RDI + 0x38));
  Kernel::TermList::TermList((TermList *)(in_RDI + 0x40));
  Kernel::TermList::TermList((TermList *)(in_RDI + 0x48));
  Kernel::TermList::TermList((TermList *)(in_RDI + 0x50));
  pTVar1 = Kernel::Term::nthArgument(in_RSI,3);
  *(uint64_t *)(in_RDI + 0x50) = pTVar1->_content;
  Kernel::Term::nthArgument(in_RSI,0);
  Kernel::Term::nthArgument(in_RSI,1);
  TVar2 = Kernel::AtomicSort::arrowSort(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  *(uint64_t *)(in_RDI + 0x48) = TVar2._content;
  TVar3 = ApplicativeHelper::getResultApplieadToNArgs(in_stack_ffffffffffffff38,0);
  *(uint64_t *)(in_RDI + 0x40) = TVar3._content;
  pDVar4 = Kernel::Signature::getChoiceOperators(DAT_01333830);
  Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::Iterator
            (in_stack_ffffffffffffff40,
             (DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             in_stack_ffffffffffffff38._content);
  it._mit._base._last = (Entry *)TVar3._content;
  it._mit._base._next = (Entry *)pDVar4;
  it._mit._base._16_8_ = TVar2._content;
  Lib::DHSet<unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::
  loadFromIterator<Lib::DHSet<unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::Iterator>
            (pDStack_60,it);
  *(undefined1 *)(in_RDI + 0x58) = 0;
  return;
}

Assistant:

AxiomsIterator(Term* term)
  {
    _set = *term->nthArgument(3);
    _headSort = AtomicSort::arrowSort(*term->nthArgument(0),*term->nthArgument(1));
    _resultSort = ApplicativeHelper::getResultApplieadToNArgs(_headSort, 1);

    //cout << "the result sort is " + _resultSort.toString() << endl;

    DHSet<unsigned>* ops = env.signature->getChoiceOperators();
    DHSet<unsigned>::Iterator opsIt(*ops);
    _choiceOps.loadFromIterator(opsIt);
    _inBetweenNextandHasNext = false;
  }